

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_context.cpp
# Opt level: O2

void __thiscall
duckdb::ClientContext::CheckIfPreparedStatementIsExecutable
          (ClientContext *this,PreparedStatementData *statement)

{
  string *name;
  bool bVar1;
  MetaTransaction *pMVar2;
  DatabaseManager *this_00;
  AttachedDatabase *pAVar3;
  InternalException *this_01;
  InvalidInputException *this_02;
  TransactionException *__return_storage_ptr__;
  StatementType type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  __node_base *p_Var4;
  allocator local_e1;
  PreparedStatementData *local_e0;
  optional_ptr<duckdb::AttachedDatabase,_true> entry;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  string local_70 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pMVar2 = TransactionContext::ActiveTransaction(&this->transaction);
  bVar1 = ValidChecker::IsInvalidated<duckdb::MetaTransaction>(pMVar2);
  if ((bVar1) && ((statement->properties).requires_valid_transaction == true)) {
    __return_storage_ptr__ = (TransactionException *)__cxa_allocate_exception(0x10);
    ErrorManager::InvalidatedTransaction(__return_storage_ptr__,this);
    __cxa_throw(__return_storage_ptr__,&TransactionException::typeinfo,
                ::std::runtime_error::~runtime_error);
  }
  pMVar2 = MetaTransaction::Get(this);
  this_00 = DatabaseManager::Get(this);
  p_Var4 = &(statement->properties).modified_databases._M_h._M_before_begin;
  local_e0 = statement;
  while( true ) {
    p_Var4 = p_Var4->_M_nxt;
    if (p_Var4 == (__node_base *)0x0) {
      return;
    }
    name = (string *)(p_Var4 + 1);
    entry = DatabaseManager::GetDatabase(this_00,this,name);
    if (entry.ptr == (AttachedDatabase *)0x0) break;
    pAVar3 = optional_ptr<duckdb::AttachedDatabase,_true>::operator->(&entry);
    if (pAVar3->type == READ_ONLY_DATABASE) {
      this_02 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                (local_70,
                 "Cannot execute statement of type \"%s\" on database \"%s\" which is attached in read-only mode!"
                 ,&local_e1);
      StatementTypeToString_abi_cxx11_(&local_90,(duckdb *)(ulong)local_e0->statement_type,type);
      ::std::__cxx11::string::string((string *)&local_b0,(string *)name);
      StringUtil::Format<std::__cxx11::string,std::__cxx11::string>
                (&local_d0,(StringUtil *)local_70,&local_90,&local_b0,in_R8);
      InvalidInputException::InvalidInputException(this_02,&local_d0);
      __cxa_throw(this_02,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    pAVar3 = optional_ptr<duckdb::AttachedDatabase,_true>::operator*(&entry);
    MetaTransaction::ModifyDatabase(pMVar2,pAVar3);
  }
  this_01 = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string((string *)&local_d0,"Database \"%s\" not found",&local_e1);
  ::std::__cxx11::string::string((string *)&local_50,(string *)name);
  InternalException::InternalException<std::__cxx11::string>(this_01,&local_d0,&local_50);
  __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void ClientContext::CheckIfPreparedStatementIsExecutable(PreparedStatementData &statement) {
	if (ValidChecker::IsInvalidated(ActiveTransaction()) && statement.properties.requires_valid_transaction) {
		throw ErrorManager::InvalidatedTransaction(*this);
	}
	auto &meta_transaction = MetaTransaction::Get(*this);
	auto &manager = DatabaseManager::Get(*this);
	for (auto &it : statement.properties.modified_databases) {
		auto &modified_database = it.first;
		auto entry = manager.GetDatabase(*this, modified_database);
		if (!entry) {
			throw InternalException("Database \"%s\" not found", modified_database);
		}
		if (entry->IsReadOnly()) {
			throw InvalidInputException(StringUtil::Format(
			    "Cannot execute statement of type \"%s\" on database \"%s\" which is attached in read-only mode!",
			    StatementTypeToString(statement.statement_type), modified_database));
		}
		meta_transaction.ModifyDatabase(*entry);
	}
}